

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O2

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericRegex
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,Ch *source,
          CrtAllocator *allocator)

{
  CrtAllocator *pCVar1;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_> ds;
  GenericStringStream<rapidjson::UTF8<char>_> ss;
  
  if (allocator == (CrtAllocator *)0x0) {
    pCVar1 = (CrtAllocator *)operator_new(1);
    allocator = pCVar1;
  }
  else {
    pCVar1 = (CrtAllocator *)0x0;
  }
  this->ownAllocator_ = pCVar1;
  this->allocator_ = allocator;
  (this->states_).allocator_ = allocator;
  (this->states_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->states_).stack_ = (char *)0x0;
  (this->states_).stackTop_ = (char *)0x0;
  (this->states_).stackEnd_ = (char *)0x0;
  (this->states_).initialCapacity_ = 0x100;
  (this->ranges_).allocator_ = allocator;
  (this->ranges_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->ranges_).stack_ = (char *)0x0;
  (this->ranges_).stackTop_ = (char *)0x0;
  (this->ranges_).stackEnd_ = (char *)0x0;
  (this->ranges_).initialCapacity_ = 0x100;
  this->root_ = 0xffffffff;
  this->stateCount_ = 0;
  this->rangeCount_ = 0;
  this->anchorBegin_ = false;
  this->anchorEnd_ = false;
  ss.src_ = source;
  ss.head_ = source;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_>::
  DecodedStream(&ds,&ss);
  GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
  Parse<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
            ((GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)this,&ds);
  return;
}

Assistant:

GenericRegex(const Ch* source, Allocator* allocator = 0) : 
        ownAllocator_(allocator ? 0 : RAPIDJSON_NEW(Allocator)()), allocator_(allocator ? allocator : ownAllocator_), 
        states_(allocator_, 256), ranges_(allocator_, 256), root_(kRegexInvalidState), stateCount_(), rangeCount_(), 
        anchorBegin_(), anchorEnd_()
    {
        GenericStringStream<Encoding> ss(source);
        DecodedStream<GenericStringStream<Encoding>, Encoding> ds(ss);
        Parse(ds);
    }